

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

Value * __thiscall Potassco::ProgramOptions::Value::desc(Value *this,DescType t,char *n)

{
  char **ppcVar1;
  char **ppcVar2;
  char *oldVal;
  DescType DVar3;
  
  if ((n != (char *)0x0) && ((t != desc_implicit || (this->flags_ = this->flags_ | 1, *n != '\0'))))
  {
    DVar3 = (DescType)this->descFlag_;
    if (this->descFlag_ == 0 || DVar3 == t) {
      (this->desc_).value = n;
      this->descFlag_ = (byte_t)t;
    }
    else {
      ppcVar1 = (char **)(this->desc_).value;
      ppcVar2 = ppcVar1;
      if (DVar3 != 8) {
        ppcVar2 = (char **)operator_new(0x18);
        (this->desc_).pack = ppcVar2;
        *ppcVar2 = (char *)0x0;
        ppcVar2[1] = (char *)0x0;
        ppcVar2[2] = (char *)0x0;
        this->descFlag_ = '\b';
        *(char ***)((long)ppcVar2 + (ulong)(DVar3 & ~desc_name) * 4) = ppcVar1;
      }
      ppcVar2[(int)t >> 1] = n;
    }
  }
  return this;
}

Assistant:

Value* Value::desc(DescType t, const char* n) {
	if (n == 0) return this;
	if (t == desc_implicit) {
		setProperty(property_implicit);
		if (!*n) return this;
	}
	if (descFlag_ == 0 || descFlag_ == t) {
		desc_.value = n;
		descFlag_ = static_cast<byte_t>(t);
		return this;
	}
	if (descFlag_ != desc_pack) {
		const char* oldVal = desc_.value;
		unsigned    oldKey = descFlag_ >> 1u;
		desc_.pack = (const char**)::operator new(sizeof(const char*[3]));
		desc_.pack[0] = desc_.pack[1] = desc_.pack[2] = 0;
		descFlag_ = desc_pack;
		desc_.pack[oldKey] = oldVal;
	}
	desc_.pack[t>>1u] = n;
	return this;
}